

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction_common.h
# Opt level: O0

AbstractTxOutReference * __thiscall
cfd::core::AbstractTxOutReference::operator=
          (AbstractTxOutReference *this,AbstractTxOutReference *param_2)

{
  long in_RSI;
  AbstractTxOutReference *in_RDI;
  
  (in_RDI->value_).amount_ = *(int64_t *)(in_RSI + 8);
  (in_RDI->value_).ignore_check_ = *(bool *)(in_RSI + 0x10);
  Script::operator=(&in_RDI->locking_script_,(Script *)(in_RSI + 0x18));
  return in_RDI;
}

Assistant:

class CFD_CORE_EXPORT AbstractTxOutReference {
 public:
  /**
   * @brief constructor.
   * @param[in] tx_out  TxOut instance to reference
   */
  explicit AbstractTxOutReference(const AbstractTxOut& tx_out);
  /**
   * @brief destructor
   */
  virtual ~AbstractTxOutReference() {
    // do nothing
  }

  /**
   * @brief Get an amount.
   * @return amount
   */
  const Amount GetValue() const { return value_; }

  /**
   * @brief Get a locking script.
   * @return locking script
   */
  const Script GetLockingScript() const { return locking_script_; }

  /**
   * @brief Get a serialized size.
   * @return serialized size
   */
  uint32_t GetSerializeSize() const;

  /**
   * @brief Get a serialized virtual size.
   * @return serialized virtual size.
   */
  uint32_t GetSerializeVsize() const;

 protected:
  Amount value_;           ///< amount
  Script locking_script_;  ///< locking script
}